

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

unsigned_long __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::get_selected(list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *this)

{
  unsigned_long uVar1;
  bool *pbVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.r = (this->super_scrollable_region).super_drawable.m;
  local_28.m = (mutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_28.r,1);
  uVar1 = (this->items).array_size;
  uVar4 = 0;
  if (uVar1 != 0) {
    pbVar2 = &((this->items).array_elements)->is_selected;
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (*pbVar2 != false) break;
      uVar3 = uVar3 + 1;
      pbVar2 = pbVar2 + 0x38;
      uVar4 = uVar1;
    } while (uVar1 != uVar3);
  }
  auto_mutex::unlock(&local_28);
  return uVar4;
}

Assistant:

unsigned long list_box<S>::
    get_selected (
    ) const
    {
        auto_mutex M(m);
        DLIB_ASSERT ( multiple_select_enabled() == false,
                "\tunsigned long list_box::get_selected()"
                 );
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (items[i].is_selected)
                return i;
        }
        return items.size();
    }